

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_groups_abi_cxx11_(Formatter *this,App *app,AppFormatMode mode)

{
  bool bVar1;
  __type_conflict _Var2;
  reference pbVar3;
  anon_class_24_3_0701af66 *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  string *group;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  reference in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  string *__rhs;
  undefined1 local_298 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_fffffffffffffd88;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_fffffffffffffd90;
  string local_260 [24];
  App *in_stack_fffffffffffffdb8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  undefined1 *local_1d8;
  undefined1 local_1c0 [24];
  stringstream local_1a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [3];
  function<bool_(const_CLI::Option_*)> *in_stack_fffffffffffffee0;
  App *in_stack_fffffffffffffee8;
  
  __rhs = in_RDI;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  App::get_groups_abi_cxx11_(in_stack_fffffffffffffdb8);
  local_1d8 = local_1c0;
  local_1e0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd38);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffd38);
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd40,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd38), ((bVar1 ^ 0xffU) & 1) != 0) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_1e0);
    ::std::function<bool(CLI::Option_const*)>::
    function<CLI::Formatter::make_groups[abi:cxx11](CLI::App_const*,CLI::AppFormatMode)const::_lambda(CLI::Option_const*)_1_,void>
              ((function<bool_(const_CLI::Option_*)> *)in_RDI,in_RDX);
    App::get_options(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::function<bool_(const_CLI::Option_*)>::~function
              ((function<bool_(const_CLI::Option_*)> *)0x3a1716);
    bVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a1723
                      );
    if ((!bVar1) &&
       (bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                          ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                           in_RDI), !bVar1)) {
      in_stack_fffffffffffffd40 = local_198;
      ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))
                (local_260,in_RSI,&stack0xfffffffffffffd80,0,local_298);
      ::std::operator<<((ostream *)in_stack_fffffffffffffd40,local_260);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd40);
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
                ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)in_RDI);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd40);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffd40);
      _Var2 = ::std::operator==(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs);
      in_stack_fffffffffffffd38 = pbVar3;
      if (((_Var2 ^ 0xffU) & 1) != 0) {
        ::std::operator<<((ostream *)local_198,"\n");
        in_stack_fffffffffffffd38 = pbVar3;
      }
    }
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)in_RDI);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1e0);
  }
  ::std::__cxx11::stringstream::str();
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __rhs;
}

Assistant:

CLI11_INLINE std::string Formatter::make_groups(const App *app, AppFormatMode mode) const {
    std::stringstream out;
    std::vector<std::string> groups = app->get_groups();

    // Options
    for(const std::string &group : groups) {
        std::vector<const Option *> opts = app->get_options([app, mode, &group](const Option *opt) {
            return opt->get_group() == group                     // Must be in the right group
                   && opt->nonpositional()                       // Must not be a positional
                   && (mode != AppFormatMode::Sub                // If mode is Sub, then
                       || (app->get_help_ptr() != opt            // Ignore help pointer
                           && app->get_help_all_ptr() != opt));  // Ignore help all pointer
        });
        if(!group.empty() && !opts.empty()) {
            out << make_group(group, false, opts);

            if(group != groups.back())
                out << "\n";
        }
    }

    return out.str();
}